

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O3

int main(int argc,char **argv)

{
  vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *pvVar1;
  RNNPointer *pRVar2;
  pointer pcVar3;
  pointer pfVar4;
  pointer pcVar5;
  pointer puVar6;
  undefined8 uVar7;
  size_type sVar8;
  char cVar9;
  __pid_t _Var10;
  mapped_type mVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ostream *poVar15;
  size_t sVar16;
  const_iterator cVar17;
  any *paVar18;
  uint *puVar19;
  double *pdVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  mapped_type *pmVar22;
  mapped_type *pmVar23;
  mapped_type *pmVar24;
  istream *piVar25;
  _Base_ptr p_Var26;
  _Rb_tree_node_base *p_Var27;
  long *plVar28;
  mapped_type *pmVar29;
  size_type sVar30;
  mapped_type *pmVar31;
  mapped_type *pmVar32;
  Tensor *t;
  long lVar33;
  mapped_type *sentenceUnkStrings;
  pointer puVar34;
  long *plVar35;
  size_type *psVar36;
  long lVar37;
  uint *w_1;
  key_type_conflict *pkVar38;
  ulong uVar39;
  pointer ppNVar40;
  pointer *ppuVar41;
  char *pcVar42;
  uint *w_2;
  pointer *ppuVar43;
  long lVar44;
  uint *w;
  _Alloc_hider __x;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  bool bVar48;
  bool bVar49;
  float fVar50;
  real rVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double local_cd8;
  double local_cd0;
  double local_cc8;
  double local_cc0;
  uint kUNK;
  int local_cb4;
  uint local_cb0;
  int argc_local;
  vector<float,_std::allocator<float>_> v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c68;
  long lStack_c50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pred;
  double right;
  uint local_c0c;
  double local_c08;
  double dStack_c00;
  double right_2;
  long local_be8;
  long local_be0;
  long lStack_bd8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  string line;
  undefined8 local_b90;
  basic_text_oprimitive<std::ostream> local_b88 [88];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tsentence_1;
  ulong local_ae8;
  double right_1;
  char **argv_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> hyp;
  string fname;
  undefined1 *local_a38 [2];
  undefined1 local_a28 [16];
  variables_map conf;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_a08 [8];
  _Rb_tree_node_base local_a00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9d8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9a8;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> singletons;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> training_vocab;
  string local_918;
  string local_8f8;
  Model model;
  istringstream lin;
  undefined4 uStack_87c;
  undefined1 local_878 [112];
  ios_base local_808 [128];
  ios_base local_788 [272];
  ParserBuilder parser;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  ostringstream os;
  ios_base local_138 [264];
  
  argc_local = argc;
  argv_local = argv;
  cnn::Initialize(&argc_local,&argv_local,0,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"COMMAND:",8);
  if (argc_local != 0) {
    uVar39 = 0;
    do {
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x20);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)&parser,1);
      pcVar42 = argv_local[uVar39];
      if (pcVar42 == (char *)0x0) {
        std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
      }
      else {
        sVar16 = strlen(pcVar42);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar42,sVar16);
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 < (uint)argc_local);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  boost::program_options::variables_map::variables_map(&conf);
  InitCommandLine(argc_local,argv_local,&conf);
  pvVar1 = &parser.stack_lstm.super_RNNBuilder.head;
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"use_pos_tags","");
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_a08,(key_type *)&parser);
  USE_POS = cVar17._M_node != &local_a00;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"use_spelling","");
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_a08,(key_type *)&parser);
  USE_SPELLING = cVar17._M_node != &local_a00;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  corpus.USE_SPELLING = USE_SPELLING;
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"layers","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  LAYERS = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"input_dim","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  INPUT_DIM = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"pretrained_dim","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  PRETRAINED_DIM = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"hidden_dim","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  HIDDEN_DIM = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"action_dim","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  ACTION_DIM = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"lstm_input_dim","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  LSTM_INPUT_DIM = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"pos_dim","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  POS_DIM = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"rel_dim","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  REL_DIM = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"beam_size","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  local_c0c = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"unk_strategy","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  puVar19 = boost::any_cast<unsigned_int_const&>(paVar18);
  uVar45 = *puVar19;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unknown word strategy: ",0x17);
  if (uVar45 != 1) {
    abort();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"STOCHASTIC REPLACEMENT\n",0x17);
  parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"unk_prob","");
  paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
  pdVar20 = boost::any_cast<double_const&>(paVar18);
  dVar53 = *pdVar20;
  if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
    operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
  }
  if (dVar53 < 0.0) {
    pcVar42 = "unk_prob >= 0.";
  }
  else {
    if (dVar53 <= 1.0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&os,"parser_",7);
      pcVar42 = "nopos";
      if (USE_POS != 0) {
        pcVar42 = "pos";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&os,pcVar42,(ulong)(USE_POS ^ 1) * 2 + 3);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&os,(char *)&parser,1)
      ;
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&parser,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&parser,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&parser,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&parser,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&parser,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder =
           (_func_int **)CONCAT71(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&parser,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"-pid",4);
      _Var10 = getpid();
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,_Var10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,".params",7);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Writing parameters to file: ",0x1c);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,fname._M_dataplus._M_p,fname._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"training_data","");
      paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
      pbVar21 = boost::any_cast<std::__cxx11::string_const&>(paVar18);
      pcVar3 = (pbVar21->_M_dataplus)._M_p;
      local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8f8,pcVar3,pcVar3 + pbVar21->_M_string_length);
      cpyp::Corpus::load_correct_actions(&corpus,&local_8f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
        operator_delete(local_8f8._M_dataplus._M_p);
      }
      if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
          parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
        operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
      }
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"UNK","");
      pmVar22 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[](&corpus.wordsToInt,(key_type *)&parser);
      mVar11 = *pmVar22;
      if (mVar11 == 0) {
        *pmVar22 = corpus.max;
        corpus.max = corpus.max + 1;
        pmVar23 = std::
                  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&corpus.intToWords,pmVar22);
        std::__cxx11::string::_M_assign((string *)pmVar23);
        corpus.nwords = corpus.max;
        mVar11 = *pmVar22;
      }
      if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
          parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
        operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
      }
      kUNK = mVar11;
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"ROOT","");
      pmVar22 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[](&corpus.wordsToInt,(key_type *)&parser);
      uVar45 = *pmVar22;
      if (uVar45 == 0) {
        *pmVar22 = corpus.max;
        corpus.max = corpus.max + 1;
        pmVar23 = std::
                  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&corpus.intToWords,pmVar22);
        std::__cxx11::string::_M_assign((string *)pmVar23);
        corpus.nwords = corpus.max;
        uVar45 = *pmVar22;
      }
      kROOT_SYMBOL = uVar45;
      if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
          parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
        operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
      }
      parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"words","");
      cVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_a08,(key_type *)&parser);
      if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
          parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
        operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
      }
      if (cVar17._M_node != &local_a00) {
        _lin = _lin & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&parser,(ulong)PRETRAINED_DIM,
                   (value_type_conflict2 *)&lin,(allocator_type *)&line);
        pmVar24 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pretrained,&kUNK);
        pfVar4 = (pmVar24->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        (pmVar24->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_start = (pointer)parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder;
        (pmVar24->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)parser.stack_lstm.super_RNNBuilder._8_8_;
        (pmVar24->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_end_of_storage =
             (pointer)parser.stack_lstm.super_RNNBuilder.head.
                      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
                      super__Vector_impl_data._M_start;
        parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)0x0;
        parser.stack_lstm.super_RNNBuilder.cur.t = 0;
        parser.stack_lstm.super_RNNBuilder.sm.q_ = CREATED;
        parser.stack_lstm.super_RNNBuilder.head.
        super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if ((pfVar4 != (pointer)0x0) &&
           (operator_delete(pfVar4),
           parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != (_func_int **)0x0)) {
          operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Loading from ",0xd);
        parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder = (_func_int **)pvVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&parser,"words","");
        paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf)
        ;
        pbVar21 = boost::any_cast<std::__cxx11::string_const&>(paVar18);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pbVar21->_M_dataplus)._M_p,
                             pbVar21->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," with",5);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," dimensions\n",0xc);
        if ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)
            parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder != pvVar1) {
          operator_delete(parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder);
        }
        _lin = local_878 + 8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&lin,"words","");
        paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf)
        ;
        pbVar21 = boost::any_cast<std::__cxx11::string_const&>(paVar18);
        std::ifstream::ifstream(&parser,(pbVar21->_M_dataplus)._M_p,_S_in);
        if (_lin != local_878 + 8) {
          operator_delete(_lin);
        }
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_allocated_capacity = line.field_2._M_allocated_capacity & 0xffffffffffffff00
        ;
        cVar9 = std::ios::widen((char)&parser +
                                (char)parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder[-3]);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&parser,(string *)&line,cVar9);
        _lin = _lin & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::vector
                  (&v,(ulong)PRETRAINED_DIM,(value_type_conflict2 *)&lin,(allocator_type *)&model);
        model.all_params.
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&model.all_params.
                       super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        model.all_params.
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        model.all_params.
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)model.all_params.
                              super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        while( true ) {
          cVar9 = std::ios::widen((char)parser.stack_lstm.super_RNNBuilder._vptr_RNNBuilder[-3] +
                                  (char)&parser);
          piVar25 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&parser,(string *)&line,cVar9);
          if (((byte)piVar25[*(long *)(*(long *)piVar25 + -0x18) + 0x20] & 5) != 0) break;
          std::__cxx11::istringstream::istringstream((istringstream *)&lin,(string *)&line,_S_in);
          std::operator>>((istream *)&lin,(string *)&model);
          if (PRETRAINED_DIM != 0) {
            uVar39 = 0;
            do {
              std::istream::_M_extract<float>((float *)&lin);
              uVar39 = uVar39 + 1;
            } while (uVar39 < PRETRAINED_DIM);
          }
          pmVar22 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[](&corpus.wordsToInt,(key_type *)&model);
          mVar11 = *pmVar22;
          if (mVar11 == 0) {
            *pmVar22 = corpus.max;
            corpus.max = corpus.max + 1;
            pmVar23 = std::
                      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&corpus.intToWords,pmVar22);
            std::__cxx11::string::_M_assign((string *)pmVar23);
            corpus.nwords = corpus.max;
            mVar11 = *pmVar22;
          }
          training_vocab._M_t._M_impl._0_4_ = mVar11;
          pmVar24 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&pretrained,(key_type *)&training_vocab);
          std::vector<float,_std::allocator<float>_>::operator=(pmVar24,&v);
          std::__cxx11::istringstream::~istringstream((istringstream *)&lin);
          std::ios_base::~ios_base(local_808);
        }
        if (model.all_params.
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&model.all_params.
                      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(model.all_params.
                          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p);
        }
        std::ifstream::~ifstream(&parser);
      }
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &training_vocab._M_t._M_impl.super__Rb_tree_header._M_header;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &singletons._M_t._M_impl.super__Rb_tree_header._M_header;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      parser.stack_lstm.super_RNNBuilder.head.
      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_finish = &parser.stack_lstm.super_RNNBuilder.cur;
      parser.stack_lstm.super_RNNBuilder._8_8_ =
           parser.stack_lstm.super_RNNBuilder._8_8_ & 0xffffffff00000000;
      parser.stack_lstm.super_RNNBuilder.head.
      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parser.stack_lstm.params.
      super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           training_vocab._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      parser.stack_lstm.super_RNNBuilder.head.
      super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           parser.stack_lstm.super_RNNBuilder.head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if ((_Rb_tree_header *)corpus.sentences._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          != &corpus.sentences._M_t._M_impl.super__Rb_tree_header) {
        p_Var26 = corpus.sentences._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          _lin = p_Var26[1]._M_color;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_878,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var26[1]._M_parent);
          uVar7 = local_878._8_8_;
          for (ppNVar40 = (pointer)local_878._0_8_; ppNVar40 != (pointer)uVar7;
              ppNVar40 = (pointer)((long)ppNVar40 + 4)) {
            line._M_dataplus._M_p._4_4_ = (undefined4)((ulong)line._M_dataplus._M_p >> 0x20);
            line._M_dataplus._M_p._0_4_ = *(uint *)ppNVar40;
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&training_vocab,(uint *)&line);
            pmVar22 = std::
                      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)&parser,(key_type_conflict *)&line);
            *pmVar22 = *pmVar22 + 1;
          }
          if ((pointer)local_878._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_878._0_8_);
          }
          p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26);
        } while ((_Rb_tree_header *)p_Var26 != &corpus.sentences._M_t._M_impl.super__Rb_tree_header)
        ;
        pRVar2 = &parser.stack_lstm.super_RNNBuilder.cur;
        if (parser.stack_lstm.super_RNNBuilder.head.
            super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
            super__Vector_impl_data._M_finish != pRVar2) {
          p_Var27 = (_Rb_tree_node_base *)
                    parser.stack_lstm.super_RNNBuilder.head.
                    super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            _lin = *(pointer *)(p_Var27 + 1);
            if ((int)((ulong)_lin >> 0x20) == 1) {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)&singletons,(uint *)&lin);
            }
            p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27);
          } while (p_Var27 != (_Rb_tree_node_base *)pRVar2);
        }
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&parser);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Number of words: ",0x11);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      VOCAB_SIZE = corpus.nwords + 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Number of UTF8 chars: ",0x16);
      plVar28 = (long *)std::ostream::operator<<(&std::cerr,corpus.maxChars);
      std::ios::widen((char)*(undefined8 *)(*plVar28 + -0x18) + (char)plVar28);
      std::ostream::put((char)plVar28);
      std::ostream::flush();
      if (0xff < corpus.maxChars) {
        CHAR_SIZE = corpus.maxChars;
      }
      ACTION_SIZE = corpus.nactions + 1;
      POS_SIZE = corpus.npos + 10;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&possible_actions,(ulong)corpus.nactions);
      puVar34 = possible_actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (corpus.nactions != 0) {
        uVar39 = 0;
        do {
          puVar34[uVar39] = (uint)uVar39;
          uVar39 = uVar39 + 1;
        } while (uVar39 < corpus.nactions);
      }
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.gradient_norm_scratch = (float *)0x0;
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ParserBuilder::ParserBuilder(&parser,&model,&pretrained);
      pcVar3 = local_878 + 8;
      _lin = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lin,"model","");
      cVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_a08,(key_type *)&lin);
      if (_lin != pcVar3) {
        operator_delete(_lin);
      }
      if (cVar17._M_node != &local_a00) {
        line._M_dataplus._M_p = (pointer)&line.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&line,"model","");
        paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf)
        ;
        pbVar21 = boost::any_cast<std::__cxx11::string_const&>(paVar18);
        std::ifstream::ifstream(&lin,(pbVar21->_M_dataplus)._M_p,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p);
        }
        boost::archive::text_iarchive::text_iarchive((text_iarchive *)&line,(istream *)&lin,0);
        boost::serialization::
        singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Model>_>::
        get_instance();
        boost::archive::detail::basic_iarchive::load_object(&line,(basic_iserializer *)&model);
        boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&line);
        boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive
                  ((basic_text_iprimitive<std::istream> *)&local_b90);
        std::ifstream::~ifstream(&lin);
      }
      _lin = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lin,"dev_data","");
      paVar18 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&conf);
      pbVar21 = boost::any_cast<std::__cxx11::string_const&>(paVar18);
      pcVar5 = (pbVar21->_M_dataplus)._M_p;
      local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_918,pcVar5,pcVar5 + pbVar21->_M_string_length);
      cpyp::Corpus::load_correct_actionsDev(&corpus,&local_918);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_918._M_dataplus._M_p != &local_918.field_2) {
        operator_delete(local_918._M_dataplus._M_p);
      }
      if (_lin != pcVar3) {
        operator_delete(_lin);
      }
      if (USE_SPELLING == true) {
        VOCAB_SIZE = corpus.nwords + 1;
      }
      _lin = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&lin,"train","");
      cVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_a08,(key_type *)&lin);
      if (_lin != pcVar3) {
        operator_delete(_lin);
      }
      if (cVar17._M_node != &local_a00) {
        signal(2,signal_callback_handler);
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)&PTR__Trainer_0029a750;
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x3dcccccd3dcccccd;
        v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x3da3d70a;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Training started.",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&order,(ulong)corpus.nsentences,(allocator_type *)&lin);
        if (corpus.nsentences == 0) {
          local_ae8 = 0;
        }
        else {
          uVar39 = 0;
          do {
            order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar39] = (uint)uVar39;
            uVar39 = uVar39 + 1;
            local_ae8 = (ulong)corpus.nsentences;
          } while (uVar39 < local_ae8);
        }
        uVar45 = (uint)local_ae8;
        local_cb0 = 100;
        if (uVar45 < 100) {
          local_cb0 = uVar45;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"NUMBER OF TRAINING SENTENCES: ",0x1e);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        uVar7 = __M_insert<void_const*>;
        pcVar3 = _VTT;
        right = 0.0;
        if (requested_stop == false) {
          local_cb4 = -1;
          local_c08 = (double)CONCAT44(local_c08._4_4_,
                                       (int)CONCAT71((int7)((ulong)__M_insert<void_const*> >> 8),1))
          ;
          local_cc0 = 0.0;
          iVar14 = 0;
          bVar49 = false;
          do {
            if (uVar45 == 0) {
              local_cd8 = 0.0;
              local_cd0 = 0.0;
            }
            else {
              local_cd8 = 0.0;
              uVar47 = 0;
              uVar46 = 0;
              do {
                uVar13 = (uint)local_ae8;
                if (uVar13 == corpus.nsentences) {
                  if (((ulong)local_c08 & 1) == 0) {
                    fVar50 = v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_ + 1.0;
                    v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)CONCAT44(fVar50,v.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_);
                    v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         (pointer)CONCAT44(v.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_finish._0_4_ /
                                           (fVar50 * v.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_ + 1.0),
                                           v.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_finish._0_4_);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"**SHUFFLE\n",10);
                  puVar6 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                  puVar34 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  if ((order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start ==
                       order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_finish) ||
                     (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1 ==
                      order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish)) {
                    local_c08 = (double)((ulong)local_c08 & 0xffffffff00000000);
                    uVar13 = 0;
                  }
                  else {
                    lVar44 = 4;
                    do {
                      iVar12 = rand();
                      lVar37 = (long)iVar12 % ((lVar44 >> 2) + 1);
                      if (lVar44 != lVar37 * 4) {
                        uVar13 = *(uint *)((long)puVar34 + lVar44);
                        *(uint *)((long)puVar34 + lVar44) = puVar34[lVar37];
                        puVar34[lVar37] = uVar13;
                      }
                      lVar37 = lVar44 + 4;
                      lVar44 = lVar44 + 4;
                    } while ((pointer)((long)puVar34 + lVar37) != puVar6);
                    local_c08 = (double)((ulong)local_c08 & 0xffffffff00000000);
                    uVar13 = 0;
                  }
                }
                local_cc0 = local_cc0 + 1.0;
                _lin = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar13];
                pmVar29 = std::
                          map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                          ::operator[](&corpus.sentences,(key_type *)&lin);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,pmVar29);
                sVar8 = line._M_string_length;
                for (__x = line._M_dataplus; __x._M_p != (pointer)sVar8; __x._M_p = __x._M_p + 4) {
                  sVar30 = std::
                           set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           ::count(&singletons,(key_type_conflict *)__x._M_p);
                  if ((sVar30 != 0) && (rVar51 = cnn::rand01(), (double)rVar51 < dVar53)) {
                    *(uint *)__x._M_p = kUNK;
                  }
                }
                _lin = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar13];
                pmVar31 = std::
                          map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                          ::operator[](&corpus.sentencesPos,(key_type *)&lin);
                _lin = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar13];
                pmVar32 = std::
                          map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                          ::operator[](&corpus.correct_act_sent,(key_type *)&lin);
                cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&lin);
                ParserBuilder::log_prob_parser
                          (&local_1c0,&parser,(ComputationGraph *)&lin,pmVar29,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,pmVar31,
                           pmVar32,&corpus.actions,&corpus.intToWords,&right);
                if (local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1c0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                t = cnn::ComputationGraph::incremental_forward((ComputationGraph *)&lin);
                rVar51 = cnn::as_scalar(t);
                if (rVar51 < 0.0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Log prob < 0 on sentence ",0x19);
                  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,": lp=",5);
                  poVar15 = std::ostream::_M_insert<double>((double)rVar51);
                  std::endl<char,std::char_traits<char>>(poVar15);
                  __assert_fail("lp >= 0.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                                ,0x416,"int main(int, char **)");
                }
                cnn::ComputationGraph::backward((ComputationGraph *)&lin);
                cnn::SimpleSGDTrainer::update((SimpleSGDTrainer *)&v,1.0);
                puVar34 = (pmVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_finish;
                puVar6 = (pmVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&lin);
                if (line._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(line._M_dataplus._M_p);
                }
                local_cd8 = local_cd8 + (double)rVar51;
                local_ae8 = (ulong)(uVar13 + 1);
                uVar47 = uVar47 + (int)((ulong)((long)puVar34 - (long)puVar6) >> 2);
                uVar46 = uVar46 + 1;
              } while (uVar46 != local_cb0);
              local_cd0 = (double)uVar47;
            }
            cnn::Trainer::status((Trainer *)&v);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"update #",8);
            local_cb4 = local_cb4 + 1;
            poVar15 = (ostream *)std::ostream::operator<<(&std::cerr,local_cb4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," (epoch ",8);
            poVar15 = std::ostream::_M_insert<double>(local_cc0 / (double)corpus.nsentences);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,")\tllh: ",7);
            poVar15 = std::ostream::_M_insert<double>(local_cd8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," ppl: ",6);
            dVar52 = exp(local_cd8 / local_cd0);
            poVar15 = std::ostream::_M_insert<double>(dVar52);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," err: ",6);
            poVar15 = std::ostream::_M_insert<double>((local_cd0 - right) / local_cd0);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
            std::ostream::put((char)poVar15);
            std::ostream::flush();
            uVar47 = corpus.nsentencesDev;
            right = 0.0;
            iVar12 = main::logc + 1;
            bVar48 = main::logc == (iVar12 / 0x19) * 0x19;
            main::logc = iVar12;
            if (bVar48) {
              right_1 = 0.0;
              lVar44 = std::chrono::_V2::system_clock::now();
              if (uVar47 == 0) {
                local_cd0 = 0.0;
                local_cd8 = 0.0;
                local_cc8 = 0.0;
              }
              else {
                local_cc8 = 0.0;
                uVar46 = 0;
                local_cd8 = 0.0;
                local_cd0 = 0.0;
                do {
                  _lin = uVar46;
                  pmVar29 = std::
                            map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            ::operator[](&corpus.sentencesDev,(key_type *)&lin);
                  _lin = uVar46;
                  pmVar31 = std::
                            map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            ::operator[](&corpus.sentencesPosDev,(key_type *)&lin);
                  _lin = uVar46;
                  pmVar32 = std::
                            map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            ::operator[](&corpus.correct_act_sentDev,(key_type *)&lin);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                            (&tsentence_1,pmVar29);
                  puVar34 = tsentence_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  pkVar38 = tsentence_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  if (USE_SPELLING == false) {
                    for (; pkVar38 != puVar34; pkVar38 = pkVar38 + 1) {
                      sVar30 = std::
                               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               ::count(&training_vocab,pkVar38);
                      if (sVar30 == 0) {
                        *pkVar38 = kUNK;
                      }
                    }
                  }
                  cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&lin);
                  line._M_dataplus._M_p = (pointer)0x0;
                  line._M_string_length = 0;
                  line.field_2._M_allocated_capacity = 0;
                  ParserBuilder::log_prob_parser
                            (&pred,&parser,(ComputationGraph *)&lin,pmVar29,&tsentence_1,pmVar31,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,
                             &corpus.actions,&corpus.intToWords,&right_1);
                  if (line._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete(line._M_dataplus._M_p);
                  }
                  lVar37 = (long)(pmVar32->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pmVar32->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start;
                  lVar33 = lVar37 >> 2;
                  auVar54._8_4_ = (int)(lVar37 >> 0x22);
                  auVar54._0_8_ = lVar33;
                  auVar54._12_4_ = 0x45300000;
                  ParserBuilder::compute_heads
                            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&line,(uint)((ulong)((long)(pmVar29->
                                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar29->
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2),
                             pmVar32,&corpus.actions,
                             (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)0x0);
                  ParserBuilder::compute_heads
                            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&hyp._M_t,
                             (uint)((ulong)((long)(pmVar29->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pmVar29->
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 )._M_impl.super__Vector_impl_data._M_start) >> 2),
                             &pred,&corpus.actions,
                             (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)0x0);
                  uVar13 = compute_correct((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&line,(
                                                  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)&hyp._M_t,
                                           (int)((ulong)((long)(pmVar29->
                                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar29->
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                                           - 1);
                  lVar37 = ((long)(pmVar29->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pmVar29->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start >> 2) + -1;
                  auVar55._8_4_ = (int)((ulong)lVar37 >> 0x20);
                  auVar55._0_8_ = lVar37;
                  auVar55._12_4_ = 0x45300000;
                  std::
                  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  ::~_Rb_tree(&hyp._M_t);
                  std::
                  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&line);
                  if (pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(pred.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&lin);
                  if (tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(tsentence_1.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  local_cd0 = local_cd0 +
                              (auVar54._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0);
                  local_cd8 = local_cd8 + (double)uVar13;
                  local_cc8 = local_cc8 +
                              (auVar55._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar37) - 4503599627370496.0);
                  uVar46 = uVar46 + 1;
                } while (uVar46 != uVar47);
              }
              ppuVar43 = &tsentence_1.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              ppuVar41 = &local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
              lVar37 = std::chrono::_V2::system_clock::now();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"  **dev (iter=",0xe);
              poVar15 = (ostream *)std::ostream::operator<<(&std::cerr,local_cb4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," epoch=",7);
              poVar15 = std::ostream::_M_insert<double>(local_cc0 / (double)corpus.nsentences);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,")\tllh=",6);
              poVar15 = std::ostream::_M_insert<double>(0.0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," ppl: ",6);
              dVar52 = exp(0.0 / local_cd0);
              poVar15 = std::ostream::_M_insert<double>(dVar52);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," err: ",6);
              poVar15 = std::ostream::_M_insert<double>((local_cd0 - right_1) / local_cd0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," uas: ",6);
              poVar15 = std::ostream::_M_insert<double>(local_cd8 / local_cc8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t[",2);
              poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," sents in ",10);
              poVar15 = std::ostream::_M_insert<double>((double)(lVar37 - lVar44) / 1000000.0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," ms]",4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
              std::ostream::put((char)poVar15);
              std::ostream::flush();
              if ((double)iVar14 < local_cd8) {
                std::ofstream::ofstream((ostream *)&lin,(string *)&fname,_S_out);
                boost::archive::text_oarchive::text_oarchive
                          ((text_oarchive *)&line,(ostream *)&lin,0);
                boost::serialization::
                singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::Model>_>
                ::get_instance();
                boost::archive::detail::basic_oarchive::save_object
                          (&line,(basic_oserializer *)&model);
                if (!bVar49) {
                  hyp._M_t._M_impl._0_8_ =
                       &hyp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&hyp," latest_model","")
                  ;
                  pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)&pred.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&pred,"rm -f ","");
                  plVar28 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&pred,hyp._M_t._M_impl._0_8_);
                  puVar34 = (pointer)(plVar28 + 2);
                  if ((pointer)*plVar28 == puVar34) {
                    tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)puVar34;
                    tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar43;
                  }
                  else {
                    tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)puVar34;
                    tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar28;
                  }
                  tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar28[1];
                  *plVar28 = (long)puVar34;
                  plVar28[1] = 0;
                  *(undefined1 *)(plVar28 + 2) = 0;
                  iVar14 = system((char *)tsentence_1.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  if (iVar14 == 0) {
                    local_a38[0] = local_a28;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"ln -s ","")
                    ;
                    plVar28 = (long *)std::__cxx11::string::_M_append
                                                ((char *)local_a38,(ulong)fname._M_dataplus._M_p);
                    plVar35 = plVar28 + 2;
                    if ((long *)*plVar28 == plVar35) {
                      local_be0 = *plVar35;
                      lStack_bd8 = plVar28[3];
                      right_2 = (double)&local_be0;
                    }
                    else {
                      local_be0 = *plVar35;
                      right_2 = (double)*plVar28;
                    }
                    local_be8 = plVar28[1];
                    *plVar28 = (long)plVar35;
                    plVar28[1] = 0;
                    *(undefined1 *)(plVar28 + 2) = 0;
                    plVar28 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&right_2,hyp._M_t._M_impl._0_8_);
                    psVar36 = (size_type *)(plVar28 + 2);
                    if ((pointer *)*plVar28 == (pointer *)psVar36) {
                      local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*psVar36;
                      lStack_c50 = plVar28[3];
                      local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar41;
                    }
                    else {
                      local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*psVar36;
                      local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar28;
                    }
                    local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar28[1];
                    *plVar28 = (long)psVar36;
                    plVar28[1] = 0;
                    *(undefined1 *)(plVar28 + 2) = 0;
                    iVar14 = system((char *)local_c68.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    bVar49 = iVar14 == 0;
                    if ((pointer *)
                        local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start != ppuVar41) {
                      operator_delete(local_c68.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if ((long *)right_2 != &local_be0) {
                      operator_delete((void *)right_2);
                    }
                    if (local_a38[0] != local_a28) {
                      operator_delete(local_a38[0]);
                    }
                  }
                  else {
                    bVar49 = false;
                  }
                  if ((pointer *)
                      tsentence_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start != ppuVar43) {
                    operator_delete(tsentence_1.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((pointer *)
                      pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      &pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(pred.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar49) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Created ",8);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,(char *)hyp._M_t._M_impl._0_8_,
                                         hyp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," as a soft link to ",0x13);
                    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar15,fname._M_dataplus._M_p,fname._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," for convenience.",0x11);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15)
                    ;
                    std::ostream::put((char)poVar15);
                    std::ostream::flush();
                  }
                  if ((_Base_ptr *)hyp._M_t._M_impl._0_8_ !=
                      &hyp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                    operator_delete((void *)hyp._M_t._M_impl._0_8_);
                  }
                }
                iVar14 = (int)local_cd8;
                boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)&line);
                boost::archive::basic_text_oprimitive<std::ostream>::~basic_text_oprimitive
                          (local_b88);
                _lin = pcVar3;
                *(undefined8 *)(&lin + *(long *)(pcVar3 + -0x18)) = uVar7;
                std::filebuf::~filebuf((filebuf *)local_878);
                std::ios_base::~ios_base(local_788);
                bVar49 = true;
              }
            }
          } while (requested_stop != true);
        }
        if (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        cnn::Trainer::~Trainer((Trainer *)&v);
      }
      right_2 = 0.0;
      lVar44 = std::chrono::_V2::system_clock::now();
      uVar45 = corpus.nsentencesDev;
      if (corpus.nsentencesDev == 0) {
        local_cd8 = 0.0;
        local_cd0 = 0.0;
        local_cc0 = 0.0;
      }
      else {
        local_cc0 = 0.0;
        local_cd0 = 0.0;
        local_cd8 = 0.0;
        uVar47 = 0;
        do {
          _lin = uVar47;
          pmVar29 = std::
                    map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&corpus.sentencesDev,(key_type *)&lin);
          _lin = uVar47;
          pmVar31 = std::
                    map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&corpus.sentencesPosDev,(key_type *)&lin);
          _lin = uVar47;
          sentenceUnkStrings =
               std::
               map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&corpus.sentencesStrDev,(key_type *)&lin);
          _lin = uVar47;
          local_cb0 = uVar47;
          pmVar32 = std::
                    map<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&corpus.correct_act_sentDev,(key_type *)&lin);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&pred,pmVar29);
          puVar34 = pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pkVar38 = pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (USE_SPELLING == false) {
            for (; pkVar38 != puVar34; pkVar38 = pkVar38 + 1) {
              sVar30 = std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       count(&training_vocab,pkVar38);
              if (sVar30 == 0) {
                *pkVar38 = kUNK;
              }
            }
          }
          cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&lin);
          local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (local_c0c != 1) {
            abort();
          }
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          ParserBuilder::log_prob_parser
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&line,&parser,
                     (ComputationGraph *)&lin,pmVar29,&pred,pmVar31,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&v,&corpus.actions,
                     &corpus.intToWords,&right_2);
          puVar34 = local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)line._M_dataplus._M_p;
          local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)line._M_string_length;
          local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)line.field_2._M_allocated_capacity;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length = 0;
          line.field_2._M_allocated_capacity = 0;
          if ((puVar34 != (pointer)0x0) &&
             (operator_delete(puVar34), line._M_dataplus._M_p != (pointer)0x0)) {
            operator_delete(line._M_dataplus._M_p);
          }
          if (v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            operator_delete(v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          lVar37 = (long)(pmVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar32->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start;
          lVar33 = lVar37 >> 2;
          auVar56._8_4_ = (int)(lVar37 >> 0x22);
          auVar56._0_8_ = lVar33;
          auVar56._12_4_ = 0x45300000;
          local_c08 = (double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0;
          dStack_c00 = auVar56._8_8_ - 1.9342813113834067e+25;
          line._M_string_length = line._M_string_length & 0xffffffff00000000;
          line.field_2._M_allocated_capacity = 0;
          line.field_2._8_8_ = &line._M_string_length;
          local_b90 = 0;
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((ulong)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_finish & 0xffffffff00000000);
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          ParserBuilder::compute_heads
                    (&hyp,(uint)((ulong)((long)(pmVar29->
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pmVar29->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data._M_start) >> 2),
                     pmVar32,&corpus.actions,
                     (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&line);
          ParserBuilder::compute_heads
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &tsentence_1,
                     (uint)((ulong)((long)(pmVar29->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pmVar29->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 2),
                     &local_c68,&corpus.actions,
                     (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&v);
          output_conll(pmVar29,pmVar31,sentenceUnkStrings,&corpus.intToWords,&corpus.intToPos,
                       (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&tsentence_1,
                       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&v);
          uVar46 = compute_correct((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&hyp._M_t,
                                   (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&tsentence_1,
                                   (int)((ulong)((long)(pmVar29->
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pmVar29->
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                                   - 1);
          lVar37 = ((long)(pmVar29->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar29->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_start >> 2) + -1;
          auVar57._8_4_ = (int)((ulong)lVar37 >> 0x20);
          auVar57._0_8_ = lVar37;
          auVar57._12_4_ = 0x45300000;
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)&tsentence_1);
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree(&hyp._M_t);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&v);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&line);
          if ((pointer *)
              local_c68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer *)0x0) {
            operator_delete(local_c68.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&lin);
          uVar47 = local_cb0;
          if (pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          local_cd8 = local_cd8 + dStack_c00 + local_c08;
          local_cd0 = local_cd0 + (double)uVar46;
          local_cc0 = local_cc0 +
                      (auVar57._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar37) - 4503599627370496.0);
          uVar47 = uVar47 + 1;
        } while (uVar47 != uVar45);
      }
      lVar37 = std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TEST llh=",9);
      poVar15 = std::ostream::_M_insert<double>(0.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," ppl: ",6);
      dVar53 = exp(0.0 / local_cd8);
      poVar15 = std::ostream::_M_insert<double>(dVar53);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," err: ",6);
      poVar15 = std::ostream::_M_insert<double>((local_cd8 - right_2) / local_cd8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," uas: ",6);
      poVar15 = std::ostream::_M_insert<double>(local_cd0 / local_cc0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\t[",2);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," sents in ",10);
      poVar15 = std::ostream::_M_insert<double>((double)(lVar37 - lVar44) / 1000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," ms]",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      ParserBuilder::~ParserBuilder(&parser);
      cnn::Model::~Model(&model);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&singletons._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&training_vocab._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
      std::ios_base::~ios_base(local_138);
      _conf = &boost::archive::detail::basic_oarchive::typeinfo;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_9a8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(local_9d8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::~_Rb_tree(local_a08);
      return 0;
    }
    pcVar42 = "unk_prob <= 1.";
  }
  __assert_fail(pcVar42,
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/parser/lstm-parse.cc"
                ,0x3a5,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv);

  cerr << "COMMAND:"; 
  for (unsigned i = 0; i < static_cast<unsigned>(argc); ++i) cerr << ' ' << argv[i];
  cerr << endl;
  unsigned status_every_i_iterations = 100;

  po::variables_map conf;
  InitCommandLine(argc, argv, &conf);
  USE_POS = conf.count("use_pos_tags");

  USE_SPELLING=conf.count("use_spelling"); //Miguel
  corpus.USE_SPELLING=USE_SPELLING;

  LAYERS = conf["layers"].as<unsigned>();
  INPUT_DIM = conf["input_dim"].as<unsigned>();
  PRETRAINED_DIM = conf["pretrained_dim"].as<unsigned>();
  HIDDEN_DIM = conf["hidden_dim"].as<unsigned>();
  ACTION_DIM = conf["action_dim"].as<unsigned>();
  LSTM_INPUT_DIM = conf["lstm_input_dim"].as<unsigned>();
  POS_DIM = conf["pos_dim"].as<unsigned>();
  REL_DIM = conf["rel_dim"].as<unsigned>();
  const unsigned beam_size = conf["beam_size"].as<unsigned>();
  const unsigned unk_strategy = conf["unk_strategy"].as<unsigned>();
  cerr << "Unknown word strategy: ";
  if (unk_strategy == 1) {
    cerr << "STOCHASTIC REPLACEMENT\n";
  } else {
    abort();
  }
  const double unk_prob = conf["unk_prob"].as<double>();
  assert(unk_prob >= 0.); assert(unk_prob <= 1.);
  ostringstream os;
  os << "parser_" << (USE_POS ? "pos" : "nopos")
     << '_' << LAYERS
     << '_' << INPUT_DIM
     << '_' << HIDDEN_DIM
     << '_' << ACTION_DIM
     << '_' << LSTM_INPUT_DIM
     << '_' << POS_DIM
     << '_' << REL_DIM
     << "-pid" << getpid() << ".params";
  int best_correct_heads = 0;
  const string fname = os.str();
  cerr << "Writing parameters to file: " << fname << endl;
  bool softlinkCreated = false;
  corpus.load_correct_actions(conf["training_data"].as<string>());	
  const unsigned kUNK = corpus.get_or_add_word(cpyp::Corpus::UNK);
  kROOT_SYMBOL = corpus.get_or_add_word(ROOT_SYMBOL);

  if (conf.count("words")) {
    pretrained[kUNK] = vector<float>(PRETRAINED_DIM, 0);
    cerr << "Loading from " << conf["words"].as<string>() << " with" << PRETRAINED_DIM << " dimensions\n";
    ifstream in(conf["words"].as<string>().c_str());
    string line;
    getline(in, line);
    vector<float> v(PRETRAINED_DIM, 0);
    string word;
    while (getline(in, line)) {
      istringstream lin(line);
      lin >> word;
      for (unsigned i = 0; i < PRETRAINED_DIM; ++i) lin >> v[i];
      unsigned id = corpus.get_or_add_word(word);
      pretrained[id] = v;
    }
  }

  set<unsigned> training_vocab; // words available in the training corpus
  set<unsigned> singletons;
  {  // compute the singletons in the parser's training data
    map<unsigned, unsigned> counts;
    for (auto sent : corpus.sentences)
      for (auto word : sent.second) { training_vocab.insert(word); counts[word]++; }
    for (auto wc : counts)
      if (wc.second == 1) singletons.insert(wc.first);
  }

  cerr << "Number of words: " << corpus.nwords << endl;
  VOCAB_SIZE = corpus.nwords + 1;

  cerr << "Number of UTF8 chars: " << corpus.maxChars << endl;
  if (corpus.maxChars>255) CHAR_SIZE=corpus.maxChars;

  ACTION_SIZE = corpus.nactions + 1;
  //POS_SIZE = corpus.npos + 1;
  POS_SIZE = corpus.npos + 10;
  possible_actions.resize(corpus.nactions);
  for (unsigned i = 0; i < corpus.nactions; ++i)
    possible_actions[i] = i;

  Model model;
  ParserBuilder parser(&model, pretrained);
  if (conf.count("model")) {
    ifstream in(conf["model"].as<string>().c_str());
    boost::archive::text_iarchive ia(in);
    ia >> model;
  }

  // OOV words will be replaced by UNK tokens
  corpus.load_correct_actionsDev(conf["dev_data"].as<string>());
  if (USE_SPELLING) VOCAB_SIZE = corpus.nwords + 1;
  //TRAINING
  if (conf.count("train")) {
    signal(SIGINT, signal_callback_handler);
    SimpleSGDTrainer sgd(&model);
    //MomentumSGDTrainer sgd(&model);
    sgd.eta_decay = 0.08;
    //sgd.eta_decay = 0.05;
    cerr << "Training started."<<"\n";
    vector<unsigned> order(corpus.nsentences);
    for (unsigned i = 0; i < corpus.nsentences; ++i)
      order[i] = i;
    double tot_seen = 0;
    status_every_i_iterations = min(status_every_i_iterations, corpus.nsentences);
    unsigned si = corpus.nsentences;
    cerr << "NUMBER OF TRAINING SENTENCES: " << corpus.nsentences << endl;
    unsigned trs = 0;
    double right = 0;
    double llh = 0;
    bool first = true;
    int iter = -1;
    while(!requested_stop) {
      ++iter;
      for (unsigned sii = 0; sii < status_every_i_iterations; ++sii) {
           if (si == corpus.nsentences) {
             si = 0;
             if (first) { first = false; } else { sgd.update_epoch(); }
             cerr << "**SHUFFLE\n";
             random_shuffle(order.begin(), order.end());
           }
           tot_seen += 1;
           const vector<unsigned>& sentence=corpus.sentences[order[si]];
           vector<unsigned> tsentence=sentence;
           if (unk_strategy == 1) {
             for (auto& w : tsentence)
               if (singletons.count(w) && cnn::rand01() < unk_prob) w = kUNK;
           }
	   const vector<unsigned>& sentencePos=corpus.sentencesPos[order[si]]; 
	   const vector<unsigned>& actions=corpus.correct_act_sent[order[si]];
           ComputationGraph hg;
           parser.log_prob_parser(&hg,sentence,tsentence,sentencePos,actions,corpus.actions,corpus.intToWords,&right);
           double lp = as_scalar(hg.incremental_forward());
           if (lp < 0) {
             cerr << "Log prob < 0 on sentence " << order[si] << ": lp=" << lp << endl;
             assert(lp >= 0.0);
           }
           hg.backward();
           sgd.update(1.0);
           llh += lp;
           ++si;
           trs += actions.size();
      }
      sgd.status();
      cerr << "update #" << iter << " (epoch " << (tot_seen / corpus.nsentences) << ")\tllh: "<< llh<<" ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << endl;
      llh = trs = right = 0;

      static int logc = 0;
      ++logc;
      if (logc % 25 == 1) { // report on dev set
        unsigned dev_size = corpus.nsentencesDev;
        // dev_size = 100;
        double llh = 0;
        double trs = 0;
        double right = 0;
        double correct_heads = 0;
        double total_heads = 0;
        auto t_start = std::chrono::high_resolution_clock::now();
        for (unsigned sii = 0; sii < dev_size; ++sii) {
           const vector<unsigned>& sentence=corpus.sentencesDev[sii];
	   const vector<unsigned>& sentencePos=corpus.sentencesPosDev[sii]; 
	   const vector<unsigned>& actions=corpus.correct_act_sentDev[sii];
           vector<unsigned> tsentence=sentence;
	   if (!USE_SPELLING) {
                for (auto& w : tsentence)
                    if (training_vocab.count(w) == 0) w = kUNK;
           }

           ComputationGraph hg;
	   vector<unsigned> pred = parser.log_prob_parser(&hg,sentence,tsentence,sentencePos,vector<unsigned>(),corpus.actions,corpus.intToWords,&right);
	   double lp = 0;
           //vector<unsigned> pred = parser.log_prob_parser_beam(&hg,sentence,sentencePos,corpus.actions,beam_size,&lp);
           llh -= lp;
           trs += actions.size();
           map<int,int> ref = parser.compute_heads(sentence.size(), actions, corpus.actions);
           map<int,int> hyp = parser.compute_heads(sentence.size(), pred, corpus.actions);
           //output_conll(sentence, corpus.intToWords, ref, hyp);
           correct_heads += compute_correct(ref, hyp, sentence.size() - 1);
           total_heads += sentence.size() - 1;
        }
        auto t_end = std::chrono::high_resolution_clock::now();
        cerr << "  **dev (iter=" << iter << " epoch=" << (tot_seen / corpus.nsentences) << ")\tllh=" << llh << " ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << " uas: " << (correct_heads / total_heads) << "\t[" << dev_size << " sents in " << std::chrono::duration<double, std::milli>(t_end-t_start).count() << " ms]" << endl;
        if (correct_heads > best_correct_heads) {
          best_correct_heads = correct_heads;
          ofstream out(fname);
          boost::archive::text_oarchive oa(out);
          oa << model;
          // Create a soft link to the most recent model in order to make it
          // easier to refer to it in a shell script.
          if (!softlinkCreated) {
            string softlink = " latest_model";
            if (system((string("rm -f ") + softlink).c_str()) == 0 && 
                system((string("ln -s ") + fname + softlink).c_str()) == 0) {
              cerr << "Created " << softlink << " as a soft link to " << fname 
                   << " for convenience." << endl;
            }
            softlinkCreated = true;
          }
        }
      }
    }
  } // should do training?
  if (true) { // do test evaluation
    double llh = 0;
    double trs = 0;
    double right = 0;
    double correct_heads = 0;
    double total_heads = 0;
    auto t_start = std::chrono::high_resolution_clock::now();
    unsigned corpus_size = corpus.nsentencesDev;
    for (unsigned sii = 0; sii < corpus_size; ++sii) {
      const vector<unsigned>& sentence=corpus.sentencesDev[sii];
      const vector<unsigned>& sentencePos=corpus.sentencesPosDev[sii]; 
      const vector<string>& sentenceUnkStr=corpus.sentencesStrDev[sii]; 
      const vector<unsigned>& actions=corpus.correct_act_sentDev[sii];
      vector<unsigned> tsentence=sentence;
      if (!USE_SPELLING) {
        for (auto& w : tsentence)
	  if (training_vocab.count(w) == 0) w = kUNK;
      }
      ComputationGraph cg;
      double lp = 0;
      vector<unsigned> pred;
      if (beam_size == 1)
        pred = parser.log_prob_parser(&cg,sentence,tsentence,sentencePos,vector<unsigned>(),corpus.actions,corpus.intToWords,&right);
      else
        pred = parser.log_prob_parser_beam(&cg,sentence,tsentence,sentencePos,corpus.actions,beam_size,&lp);
      llh -= lp;
      trs += actions.size();
      map<int, string> rel_ref, rel_hyp;
      map<int,int> ref = parser.compute_heads(sentence.size(), actions, corpus.actions, &rel_ref);
      map<int,int> hyp = parser.compute_heads(sentence.size(), pred, corpus.actions, &rel_hyp);
      output_conll(sentence, sentencePos, sentenceUnkStr, corpus.intToWords, corpus.intToPos, hyp, rel_hyp);
      correct_heads += compute_correct(ref, hyp, sentence.size() - 1);
      total_heads += sentence.size() - 1;
    }
    auto t_end = std::chrono::high_resolution_clock::now();
    cerr << "TEST llh=" << llh << " ppl: " << exp(llh / trs) << " err: " << (trs - right) / trs << " uas: " << (correct_heads / total_heads) << "\t[" << corpus_size << " sents in " << std::chrono::duration<double, std::milli>(t_end-t_start).count() << " ms]" << endl;
  }
  for (unsigned i = 0; i < corpus.actions.size(); ++i) {
    //cerr << corpus.actions[i] << '\t' << parser.p_r->values[i].transpose() << endl;
    //cerr << corpus.actions[i] << '\t' << parser.p_p2a->values.col(i).transpose() << endl;
  }
}